

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkTrajectory.cpp
# Opt level: O2

void __thiscall chrono::ChLinkTrajectory::UpdateTime(ChLinkTrajectory *this,double time)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ChLog *this_00;
  element_type *peVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Vector result;
  Vector resultA;
  Vector resultB;
  ChMatrix33<double> mw;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double local_98;
  double dStack_90;
  double local_88;
  double local_78;
  double dStack_70;
  double local_68;
  ChMatrix33<double> local_58;
  
  (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.super_ChLink.super_ChLinkBase.
  super_ChPhysicsItem.super_ChObj.ChTime = time;
  local_c8 = time;
  (*((this->space_fx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[4])();
  local_c0 = time + 0.0001;
  (*((this->space_fx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[4])();
  local_d0 = time + -0.0001;
  (*((this->space_fx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[4])();
  peVar3 = (this->trajectory_line).
           super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar3 == (element_type *)0x0) {
    this_00 = GetLog();
    ChStreamOutAscii::operator<<(&this_00->super_ChStreamOutAscii,"NO TRAJECTORY \n");
    return;
  }
  local_a8 = 0.0;
  local_68 = 0.0;
  local_88 = 0.0;
  local_b8 = 0.0;
  dStack_b0 = 0.0;
  local_78 = 0.0;
  dStack_70 = 0.0;
  local_98 = 0.0;
  dStack_90 = 0.0;
  if (this->modulo_s == true) {
    local_c8 = fmod(local_c8,1.0);
    local_d0 = fmod(local_d0,1.0);
    local_c0 = fmod(local_c0,1.0);
    peVar3 = (this->trajectory_line).
             super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  (*(peVar3->super_ChGeometry)._vptr_ChGeometry[0xb])(local_c8,peVar3,&local_b8);
  peVar3 = (this->trajectory_line).
           super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar3->super_ChGeometry)._vptr_ChGeometry[0xb])(local_d0,peVar3,&local_98);
  peVar3 = (this->trajectory_line).
           super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar3->super_ChGeometry)._vptr_ChGeometry[0xb])(local_c0,peVar3,&local_78);
  ChMatrix33<double>::Set_A_quaternion
            (&local_58,
             &(((this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.marker2)->
              abs_frame).super_ChFrame<double>.coord.rot);
  ChMarker::Impose_Rel_Coord
            ((this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.marker2,
             (Coordsys *)CSYSNORM);
  if ((Coordsys *)&local_b8 != &(this->super_ChLinkLockLock).deltaC) {
    (this->super_ChLinkLockLock).deltaC.pos.m_data[0] = local_b8;
    (this->super_ChLinkLockLock).deltaC.pos.m_data[1] = dStack_b0;
    (this->super_ChLinkLockLock).deltaC.pos.m_data[2] = local_a8;
  }
  auVar2._8_8_ = dStack_70;
  auVar2._0_8_ = local_78;
  auVar5._8_8_ = dStack_90;
  auVar5._0_8_ = local_98;
  auVar6._0_8_ = local_b8 + local_b8;
  auVar6._8_8_ = dStack_b0 + dStack_b0;
  auVar7._0_8_ = local_78 + local_98;
  auVar7._8_8_ = dStack_70 + dStack_90;
  auVar5 = vsubpd_avx(auVar2,auVar5);
  auVar4._8_8_ = 0x40b3880000000000;
  auVar4._0_8_ = 0x40b3880000000000;
  auVar4 = vmulpd_avx512vl(auVar5,auVar4);
  auVar5 = vsubpd_avx(auVar7,auVar6);
  auVar1._8_8_ = 0x4197d78400000000;
  auVar1._0_8_ = 0x4197d78400000000;
  auVar5 = vmulpd_avx512vl(auVar5,auVar1);
  *(undefined1 (*) [16])(this->super_ChLinkLockLock).deltaC_dt.pos.m_data = auVar4;
  (this->super_ChLinkLockLock).deltaC_dt.pos.m_data[2] = (local_68 - local_88) * 5000.0;
  *(undefined1 (*) [16])(this->super_ChLinkLockLock).deltaC_dtdt.pos.m_data = auVar5;
  (this->super_ChLinkLockLock).deltaC_dtdt.pos.m_data[2] =
       ((local_68 + local_88) - (local_a8 + local_a8)) * 100000000.0;
  ChQuaternion<double>::operator=
            (&(this->super_ChLinkLockLock).deltaC.rot,(ChQuaternion<double> *)&QUNIT);
  ChQuaternion<double>::operator=
            (&(this->super_ChLinkLockLock).deltaC_dt.rot,(ChQuaternion<double> *)QNULL);
  ChQuaternion<double>::operator=
            (&(this->super_ChLinkLockLock).deltaC_dtdt.rot,(ChQuaternion<double> *)QNULL);
  return;
}

Assistant:

void ChLinkTrajectory::UpdateTime(double time) {
    ChTime = time;

    double tstep = BDF_STEP_HIGH;
    double tr_time = space_fx->Get_y(time);
    double tr_timeB = space_fx->Get_y(time + tstep);
    double tr_timeA = space_fx->Get_y(time - tstep);

    if (trajectory_line) {
        Vector result, resultB, resultA;
        if (modulo_s) {
            tr_time = fmod(tr_time, 1);
            tr_timeA = fmod(tr_timeA, 1);
            tr_timeB = fmod(tr_timeB, 1);
        }
        trajectory_line->Evaluate(result, tr_time);
        trajectory_line->Evaluate(resultA, tr_timeA);
        trajectory_line->Evaluate(resultB, tr_timeB);

        ChMatrix33<> mw;
        mw.Set_A_quaternion(marker2->GetAbsCoord().rot);

        // if line coordinate is relative to body2:
        marker2->Impose_Rel_Coord(CSYSNORM);
        deltaC.pos = result;
        deltaC_dt.pos = (resultB - resultA) * (1 / (2 * tstep));
        deltaC_dtdt.pos = (resultA + resultB - result * 2) * (4 / pow(2 * tstep, 2));
        /*
        // if line coordinate is relative to absolute space:
        deltaC.pos = mw.transpose() * (result - marker2->GetAbsCoord().pos);  //// CORRECT?
        deltaC_dt.pos = mw.transpose() * ((resultB - resultA) * (1 / (2 * tstep)));
        deltaC_dtdt.pos = mw.transpose() * ((resultA + resultB - result * 2) * (4 / pow(2 * tstep, 2)));
        */

        deltaC.rot = QUNIT;
        deltaC_dt.rot = QNULL;
        deltaC_dtdt.rot = QNULL;
    } else {
        GetLog() << "NO TRAJECTORY \n";
    }
}